

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluHashFindMedian(If_Man_t *p,int t)

{
  int *piVar1;
  uint *__ptr;
  void *__ptr_00;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  void **ppvVar11;
  
  __ptr = (uint *)malloc(0x10);
  *__ptr = 1000;
  __ptr_00 = calloc(1,4000);
  uVar6 = 1000;
  *(void **)(__ptr + 2) = __ptr_00;
  __ptr[1] = 1000;
  uVar10 = 1000;
  uVar3 = 0;
  iVar8 = 0;
  for (lVar9 = 0; lVar9 < p->nTableSize[t]; lVar9 = lVar9 + 1) {
    ppvVar11 = p->pHashTable[t] + lVar9;
    while (ppvVar11 = (void **)*ppvVar11, ppvVar11 != (void **)0x0) {
      uVar7 = *(uint *)((long)ppvVar11 + 0xc);
      uVar5 = uVar7;
      if ((int)uVar3 < (int)uVar7) {
        if ((int)uVar10 <= (int)uVar7) {
          uVar5 = (uint)((long)(int)uVar7 + 1);
          uVar3 = uVar5;
          if ((((int)(uVar6 * 2) <= (int)uVar7) || (uVar3 = uVar6 * 2, (int)uVar6 <= (int)uVar7)) &&
             ((int)uVar6 < (int)uVar3)) {
            if (__ptr_00 == (void *)0x0) {
              __ptr_00 = malloc((ulong)uVar3 << 2);
            }
            else {
              __ptr_00 = realloc(__ptr_00,(ulong)uVar3 << 2);
            }
            *(void **)(__ptr + 2) = __ptr_00;
            if (__ptr_00 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *__ptr = uVar3;
            uVar6 = uVar3;
          }
          for (lVar2 = (long)(int)uVar10; lVar2 < (long)(int)uVar7 + 1; lVar2 = lVar2 + 1) {
            *(undefined4 *)((long)__ptr_00 + lVar2 * 4) = 0;
          }
          __ptr[1] = uVar5;
        }
        *(undefined4 *)((long)__ptr_00 + (ulong)uVar7 * 4) = 0;
        uVar5 = *(uint *)((long)ppvVar11 + 0xc);
        uVar3 = uVar7;
      }
      if (((int)uVar5 < 0) || (uVar10 = __ptr[1], (int)uVar10 <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)((long)__ptr_00 + (ulong)uVar5 * 4);
      *piVar1 = *piVar1 + 1;
      iVar8 = iVar8 + 1;
    }
  }
  uVar6 = (int)uVar3 >> 0x1f & uVar3;
  iVar4 = 0;
  for (; uVar7 = uVar6, 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    if ((int)uVar10 <= (int)uVar3) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar4 = iVar4 + *(int *)((long)__ptr_00 + (ulong)uVar3 * 4);
    uVar7 = uVar3;
    if (iVar8 / 2 < iVar4) break;
  }
  free(__ptr_00);
  free(__ptr);
  uVar10 = 1;
  if (1 < (int)uVar7) {
    uVar10 = uVar7;
  }
  return uVar10;
}

Assistant:

int If_CluHashFindMedian( If_Man_t * p, int t )
{
    If_Hte_t * pEntry;
    Vec_Int_t * vCounters;
    int i, Max = 0, Total = 0, Half = 0;
    vCounters = Vec_IntStart( 1000 );
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
        {
            if ( Max < (int)pEntry->Counter )
            {
                Max = pEntry->Counter;
                Vec_IntSetEntry( vCounters, pEntry->Counter, 0 );
            }
            Vec_IntAddToEntry( vCounters, pEntry->Counter, 1 );
            Total++;
        }
    }
    for ( i = Max; i > 0; i-- )
    {
        Half += Vec_IntEntry( vCounters, i );
        if ( Half > Total/2 )
            break;
    }
/*
    printf( "total = %d  ", Total );
    printf( "half = %d  ", Half );
    printf( "i = %d  ", i );
    printf( "Max = %d.\n", Max );
*/
    Vec_IntFree( vCounters );
    return Abc_MaxInt( i, 1 );
}